

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::_updateBuffers(Sandbox *this)

{
  unsigned_long uVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  ulong uVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  ostream *poVar10;
  void *pvVar11;
  reference pvVar12;
  reference ppFVar13;
  Fbo *pFVar14;
  reference ppPVar15;
  PingPong *this_00;
  reference pvVar16;
  reference pvVar17;
  string *psVar18;
  reference pvVar19;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  DefaultShaders _type_04;
  DefaultShaders _type_05;
  DefaultShaders _type_06;
  DefaultShaders _type_07;
  DefaultShaders _type_08;
  DefaultShaders _type_09;
  DefaultShaders _type_10;
  BuffersList *this_01;
  DoubleBuffersList *this_02;
  PyramidsList *this_03;
  vec3 vVar20;
  string local_1050;
  allocator local_1029;
  string local_1028 [32];
  string local_1008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  unsigned_long local_fc8;
  size_t i_13;
  string local_fa0;
  string local_f80;
  allocator local_f59;
  string local_f58;
  allocator local_f31;
  string local_f30;
  anon_class_8_1_8991fb9c local_f10;
  Flood local_f08;
  Shader local_e48;
  undefined8 local_d48;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_d40;
  string local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  undefined8 local_cf8;
  vec3 size_3;
  int i_12;
  size_t i_11;
  allocator local_cb9;
  string local_cb8 [32];
  string local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  unsigned_long local_c58;
  size_t i_10;
  string local_c30;
  string local_c10;
  allocator local_be9;
  string local_be8;
  allocator local_bc1;
  string local_bc0;
  Fbo local_ba0;
  anon_class_8_1_8991fb9c local_b68;
  Pyramid local_b60;
  Shader local_5e0;
  undefined8 local_4e0;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_4d8;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined8 local_490;
  vec3 size_2;
  int i_9;
  size_t i_8;
  ulong local_458;
  size_t i_7;
  allocator local_429;
  string local_428 [32];
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  Shader local_3c8;
  undefined8 local_2c8;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_2c0;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined8 local_278;
  vec3 size_1;
  int local_25c;
  ulong uStack_258;
  int i_6;
  size_t i_5;
  size_t i_4;
  ulong local_228;
  size_t i_3;
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  Shader local_198;
  undefined8 local_98;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  vec3 size;
  Fbo *local_30;
  int local_24;
  ulong uStack_20;
  int i_2;
  size_t i_1;
  size_t i;
  Sandbox *this_local;
  
  iVar7 = this->m_buffers_total;
  i = (size_t)this;
  sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&(this->uniforms).buffers);
  if (iVar7 == (int)sVar9) {
    for (local_228 = 0; uVar3 = local_228,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_buffers_shaders), uVar3 < sVar9; local_228 = local_228 + 1) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_buffers_shaders,local_228);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_4,(vera *)0x5,_type_00);
      vera::Shader::setSource(pvVar12,&this->m_frag_source,(string *)&i_4);
      std::__cxx11::string::~string((string *)&i_4);
    }
  }
  else {
    if ((this->verbose & 1U) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Creating/removing ");
      sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size
                        (&(this->uniforms).buffers);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar9);
      poVar10 = std::operator<<(poVar10," buffers to match ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,this->m_buffers_total);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    for (i_1 = 0; sVar5 = i_1,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_buffers_shaders), sVar5 < sVar9; i_1 = i_1 + 1) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_buffers_shaders,i_1);
      bVar6 = vera::Shader::isLoaded(pvVar12);
      if (bVar6) {
        pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                            (&this->m_buffers_shaders,i_1);
        vera::Shader::detach(pvVar12,0x8b31);
      }
    }
    for (uStack_20 = 0; uVar3 = uStack_20,
        sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size
                          (&(this->uniforms).buffers), uVar3 < sVar9; uStack_20 = uStack_20 + 1) {
      ppFVar13 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&(this->uniforms).buffers,uStack_20);
      if (*ppFVar13 != (value_type)0x0) {
        (*(*ppFVar13)->_vptr_Fbo[1])();
      }
    }
    std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::clear(&(this->uniforms).buffers);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(&this->m_buffers_shaders);
    for (local_24 = 0; local_24 < this->m_buffers_total; local_24 = local_24 + 1) {
      pFVar14 = (Fbo *)operator_new(0x38);
      vera::Fbo::Fbo(pFVar14);
      local_30 = pFVar14;
      std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::push_back
                (&(this->uniforms).buffers,&local_30);
      vera::toString<int>(&local_88,&local_24);
      std::operator+(&local_68,"u_buffer",&local_88);
      vVar20 = getBufferSize(&this->m_frag_source,&local_68);
      local_90 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar20.field_2;
      local_98 = vVar20._0_8_;
      local_48 = local_98;
      size.field_0 = local_90;
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      this_01 = &(this->uniforms).buffers;
      ppFVar13 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (this_01,(long)local_24);
      (*(*ppFVar13)->_vptr_Fbo[2])
                (*ppFVar13,(long)(float)local_48 & 0xffffffff,(long)local_48._4_4_ & 0xffffffff,2,0,
                 0,1);
      aVar2 = size.field_0;
      ppFVar13 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (this_01,(long)local_24);
      (*ppFVar13)->scale = (float)aVar2;
      vera::Shader::Shader(&local_198);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::push_back
                (&this->m_buffers_shaders,&local_198);
      vera::Shader::~Shader(&local_198);
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_buffers_shaders,(long)local_24);
      vera::toString<int>(&local_1d8,&local_24);
      std::operator+(&local_1b8,"BUFFER_",&local_1d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"",&local_1f9);
      (*(pvVar12->super_HaveDefines)._vptr_HaveDefines[10])(pvVar12,&local_1b8,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_buffers_shaders,(long)local_24);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_3,(vera *)0x5,_type);
      vera::Shader::setSource(pvVar12,&this->m_frag_source,(string *)&i_3);
      std::__cxx11::string::~string((string *)&i_3);
    }
  }
  iVar7 = this->m_doubleBuffers_total;
  sVar9 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                    (&(this->uniforms).doubleBuffers);
  if (iVar7 == (int)sVar9) {
    for (local_458 = 0; uVar3 = local_458,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_doubleBuffers_shaders), uVar3 < sVar9; local_458 = local_458 + 1
        ) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_doubleBuffers_shaders,local_458);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_8,(vera *)0x5,_type_02);
      vera::Shader::setSource(pvVar12,&this->m_frag_source,(string *)&i_8);
      std::__cxx11::string::~string((string *)&i_8);
    }
  }
  else {
    if ((this->verbose & 1U) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Creating/removing ");
      sVar9 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                        (&(this->uniforms).doubleBuffers);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar9);
      poVar10 = std::operator<<(poVar10," double buffers to match ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,this->m_doubleBuffers_total);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    for (i_5 = 0; sVar5 = i_5,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_doubleBuffers_shaders), sVar5 < sVar9; i_5 = i_5 + 1) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_doubleBuffers_shaders,i_5);
      bVar6 = vera::Shader::isLoaded(pvVar12);
      if (bVar6) {
        pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                            (&this->m_doubleBuffers_shaders,i_5);
        vera::Shader::detach(pvVar12,0x8b31);
      }
    }
    for (uStack_258 = 0; uVar3 = uStack_258,
        sVar9 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                          (&(this->uniforms).doubleBuffers), uVar3 < sVar9;
        uStack_258 = uStack_258 + 1) {
      ppPVar15 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                           (&(this->uniforms).doubleBuffers,uStack_258);
      if (*ppPVar15 != (value_type)0x0) {
        (*(*ppPVar15)->_vptr_PingPong[1])();
      }
    }
    std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::clear
              (&(this->uniforms).doubleBuffers);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(&this->m_doubleBuffers_shaders);
    for (local_25c = 0; local_25c < this->m_doubleBuffers_total; local_25c = local_25c + 1) {
      this_00 = (PingPong *)operator_new(0x90);
      vera::PingPong::PingPong(this_00);
      unique0x10001e81 = this_00;
      std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::push_back
                (&(this->uniforms).doubleBuffers,(value_type *)&size_1.field_2);
      vera::toString<int>(&local_2b8,&local_25c);
      std::operator+(&local_298,"u_doubleBuffer",&local_2b8);
      vVar20 = getBufferSize(&this->m_frag_source,&local_298);
      local_2c0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar20.field_2;
      local_2c8 = vVar20._0_8_;
      local_278 = local_2c8;
      size_1.field_0 = local_2c0;
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      this_02 = &(this->uniforms).doubleBuffers;
      ppPVar15 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                           (this_02,(long)local_25c);
      (*(*ppPVar15)->_vptr_PingPong[2])
                (*ppPVar15,(ulong)(uint)(int)(float)local_278,(ulong)(uint)(int)local_278._4_4_,2,0,
                 0,1);
      aVar2 = size_1.field_0;
      ppPVar15 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                           (this_02,(long)local_25c);
      pFVar14 = vera::PingPong::buffer(*ppPVar15,0);
      aVar4 = size_1.field_0;
      pFVar14->scale = (float)aVar2;
      ppPVar15 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                           (this_02,(long)local_25c);
      pFVar14 = vera::PingPong::buffer(*ppPVar15,1);
      pFVar14->scale = (float)aVar4;
      vera::Shader::Shader(&local_3c8);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::push_back
                (&this->m_doubleBuffers_shaders,&local_3c8);
      vera::Shader::~Shader(&local_3c8);
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_doubleBuffers_shaders,(long)local_25c);
      vera::toString<int>(&local_408,&local_25c);
      std::operator+(&local_3e8,"DOUBLE_BUFFER_",&local_408);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,"",&local_429);
      (*(pvVar12->super_HaveDefines)._vptr_HaveDefines[10])(pvVar12,&local_3e8,local_428);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_doubleBuffers_shaders,(long)local_25c);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_7,(vera *)0x5,_type_01);
      vera::Shader::setSource(pvVar12,&this->m_frag_source,(string *)&i_7);
      std::__cxx11::string::~string((string *)&i_7);
    }
  }
  iVar7 = this->m_pyramid_total;
  sVar9 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size
                    (&(this->uniforms).pyramids);
  if (iVar7 != (int)sVar9) {
    if ((this->verbose & 1U) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Removing ");
      sVar9 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size
                        (&(this->uniforms).pyramids);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar9);
      poVar10 = std::operator<<(poVar10," pyramids to create  ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,this->m_pyramid_total);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    for (stack0xfffffffffffffb80 = 0; uVar3 = stack0xfffffffffffffb80,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_pyramid_subshaders), uVar3 < sVar9;
        register0x00000000 = stack0xfffffffffffffb80 + 1) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_pyramid_subshaders,stack0xfffffffffffffb80);
      bVar6 = vera::Shader::isLoaded(pvVar12);
      if (bVar6) {
        pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                            (&this->m_pyramid_subshaders,stack0xfffffffffffffb80);
        vera::Shader::detach(pvVar12,0x8b31);
      }
    }
    std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::clear(&(this->uniforms).pyramids);
    std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::clear(&this->m_pyramid_fbos);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(&this->m_pyramid_subshaders);
    for (size_2.field_1.y = 0.0; (int)size_2.field_1 < this->m_pyramid_total;
        size_2.field_1.y = size_2.field_1.y + 1) {
      vera::toString<int>(&local_4d0,(int *)&size_2.field_1);
      std::operator+(&local_4b0,"u_pyramid",&local_4d0);
      vVar20 = getBufferSize(&this->m_frag_source,&local_4b0);
      local_4d8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar20.field_2;
      local_4e0 = vVar20._0_8_;
      local_490 = local_4e0;
      size_2.field_0 = local_4d8;
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4d0);
      vera::Shader::Shader(&local_5e0);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::push_back
                (&this->m_pyramid_subshaders,&local_5e0);
      vera::Shader::~Shader(&local_5e0);
      vera::Pyramid::Pyramid(&local_b60);
      std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::push_back
                (&(this->uniforms).pyramids,&local_b60);
      vera::Pyramid::~Pyramid(&local_b60);
      this_03 = &(this->uniforms).pyramids;
      pvVar16 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                          (this_03,(long)(int)size_2.field_1);
      vera::Pyramid::allocate(pvVar16,(int)(float)local_490,(int)local_490._4_4_);
      aVar2 = size_2.field_0;
      pvVar16 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                          (this_03,(long)(int)size_2.field_1);
      pvVar16->scale = (float)aVar2;
      local_b68.this = this;
      pvVar16 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                          (this_03,(long)(int)size_2.field_1);
      std::function<void(vera::Fbo*,vera::Fbo_const*,vera::Fbo_const*,int)>::operator=
                ((function<void(vera::Fbo*,vera::Fbo_const*,vera::Fbo_const*,int)> *)&pvVar16->pass,
                 &local_b68);
      vera::Fbo::Fbo(&local_ba0);
      std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::push_back
                (&this->m_pyramid_fbos,&local_ba0);
      vera::Fbo::~Fbo(&local_ba0);
      pvVar17 = std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::operator[]
                          (&this->m_pyramid_fbos,(long)(int)size_2.field_1);
      (*pvVar17->_vptr_Fbo[2])
                (pvVar17,(long)(float)local_490 & 0xffffffff,(long)local_490._4_4_ & 0xffffffff,2,0,
                 0,1);
      aVar2 = size_2.field_0;
      pvVar17 = std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::operator[]
                          (&this->m_pyramid_fbos,(long)(int)size_2.field_1);
      pvVar17->scale = (float)aVar2;
    }
  }
  if (0 < this->m_pyramid_total) {
    psVar18 = getSource_abi_cxx11_(this,FRAGMENT);
    bVar6 = checkPyramidAlgorithm(psVar18);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_bc0,"PYRAMID_ALGORITHM",&local_bc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_be8,"",&local_be9);
      vera::HaveDefines::addDefine
                (&(this->m_pyramid_shader).super_HaveDefines,&local_bc0,&local_be8);
      std::__cxx11::string::~string((string *)&local_be8);
      std::allocator<char>::~allocator((allocator<char> *)&local_be9);
      std::__cxx11::string::~string((string *)&local_bc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
      vera::getDefaultSrc_abi_cxx11_(&local_c10,(vera *)0x5,_type_04);
      vera::Shader::setSource(&this->m_pyramid_shader,&this->m_frag_source,&local_c10);
      std::__cxx11::string::~string((string *)&local_c10);
    }
    else {
      vera::getDefaultSrc_abi_cxx11_(&local_c30,(vera *)0x16,_type_03);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_10,(vera *)0x5,_type_05);
      vera::Shader::setSource(&this->m_pyramid_shader,&local_c30,(string *)&i_10);
      std::__cxx11::string::~string((string *)&i_10);
      std::__cxx11::string::~string((string *)&local_c30);
    }
  }
  for (local_c58 = 0; uVar1 = local_c58,
      sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                        (&this->m_pyramid_subshaders), uVar1 < sVar9; local_c58 = local_c58 + 1) {
    pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                        (&this->m_pyramid_subshaders,local_c58);
    vera::toString<unsigned_long>(&local_c98,&local_c58);
    std::operator+(&local_c78,"PYRAMID_",&local_c98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cb8,"",&local_cb9);
    (*(pvVar12->super_HaveDefines)._vptr_HaveDefines[10])(pvVar12,&local_c78,local_cb8);
    std::__cxx11::string::~string(local_cb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
    std::__cxx11::string::~string((string *)&local_c78);
    std::__cxx11::string::~string((string *)&local_c98);
    pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                        (&this->m_pyramid_subshaders,local_c58);
    vera::getDefaultSrc_abi_cxx11_((string *)&i_11,(vera *)0x5,_type_06);
    vera::Shader::setSource(pvVar12,&this->m_frag_source,(string *)&i_11);
    std::__cxx11::string::~string((string *)&i_11);
  }
  iVar7 = this->m_flood_total;
  sVar9 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::size(&(this->uniforms).floods);
  if (iVar7 != (int)sVar9) {
    if ((this->verbose & 1U) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Removing ");
      sVar9 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::size(&(this->uniforms).floods)
      ;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar9);
      poVar10 = std::operator<<(poVar10," flood to create ");
      pvVar11 = (void *)std::ostream::operator<<(poVar10,this->m_flood_total);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
    }
    for (stack0xfffffffffffff318 = 0; uVar3 = stack0xfffffffffffff318,
        sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                          (&this->m_flood_subshaders), uVar3 < sVar9;
        register0x00000000 = stack0xfffffffffffff318 + 1) {
      pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                          (&this->m_flood_subshaders,stack0xfffffffffffff318);
      bVar6 = vera::Shader::isLoaded(pvVar12);
      if (bVar6) {
        pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                            (&this->m_flood_subshaders,stack0xfffffffffffff318);
        vera::Shader::detach(pvVar12,0x8b31);
      }
    }
    std::vector<vera::Flood,_std::allocator<vera::Flood>_>::clear(&(this->uniforms).floods);
    std::vector<vera::Shader,_std::allocator<vera::Shader>_>::clear(&this->m_flood_subshaders);
    for (size_3.field_1.y = 0.0; (int)size_3.field_1 < this->m_flood_total;
        size_3.field_1.y = size_3.field_1.y + 1) {
      vera::toString<int>(&local_d38,(int *)&size_3.field_1);
      std::operator+(&local_d18,"u_flood",&local_d38);
      vVar20 = getBufferSize(&this->m_frag_source,&local_d18);
      local_d40 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar20.field_2;
      local_d48 = vVar20._0_8_;
      local_cf8 = local_d48;
      size_3.field_0 = local_d40;
      std::__cxx11::string::~string((string *)&local_d18);
      std::__cxx11::string::~string((string *)&local_d38);
      vera::Shader::Shader(&local_e48);
      std::vector<vera::Shader,_std::allocator<vera::Shader>_>::push_back
                (&this->m_flood_subshaders,&local_e48);
      vera::Shader::~Shader(&local_e48);
      vera::Flood::Flood(&local_f08);
      std::vector<vera::Flood,_std::allocator<vera::Flood>_>::push_back
                (&(this->uniforms).floods,&local_f08);
      vera::Flood::~Flood(&local_f08);
      pvVar19 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                          (&(this->uniforms).floods,(long)(int)size_3.field_1);
      (*(pvVar19->super_PingPong)._vptr_PingPong[2])
                (pvVar19,(ulong)(uint)(int)(float)local_cf8,(ulong)(uint)(int)local_cf8._4_4_,2,0,0,
                 1);
      aVar2 = size_3.field_0;
      pvVar19 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                          (&(this->uniforms).floods,(long)(int)size_3.field_1);
      pvVar19->scale = (float)aVar2;
      local_f10.this = this;
      pvVar19 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                          (&(this->uniforms).floods,(long)(int)size_3.field_1);
      std::function<void(vera::Fbo*,vera::Fbo_const*,int)>::operator=
                ((function<void(vera::Fbo*,vera::Fbo_const*,int)> *)&pvVar19->pass,&local_f10);
    }
  }
  if (0 < this->m_flood_total) {
    psVar18 = getSource_abi_cxx11_(this,FRAGMENT);
    bVar6 = checkFloodAlgorithm(psVar18);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f30,"FLOOD_ALGORITHM",&local_f31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f58,"",&local_f59);
      vera::HaveDefines::addDefine(&(this->m_flood_shader).super_HaveDefines,&local_f30,&local_f58);
      std::__cxx11::string::~string((string *)&local_f58);
      std::allocator<char>::~allocator((allocator<char> *)&local_f59);
      std::__cxx11::string::~string((string *)&local_f30);
      std::allocator<char>::~allocator((allocator<char> *)&local_f31);
      vera::getDefaultSrc_abi_cxx11_(&local_f80,(vera *)0x5,_type_08);
      vera::Shader::setSource(&this->m_flood_shader,&this->m_frag_source,&local_f80);
      std::__cxx11::string::~string((string *)&local_f80);
    }
    else {
      vera::getDefaultSrc_abi_cxx11_(&local_fa0,(vera *)0x17,_type_07);
      vera::getDefaultSrc_abi_cxx11_((string *)&i_13,(vera *)0x5,_type_09);
      vera::Shader::setSource(&this->m_flood_shader,&local_fa0,(string *)&i_13);
      std::__cxx11::string::~string((string *)&i_13);
      std::__cxx11::string::~string((string *)&local_fa0);
    }
  }
  for (local_fc8 = 0; uVar1 = local_fc8,
      sVar9 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::size
                        (&this->m_flood_subshaders), uVar1 < sVar9; local_fc8 = local_fc8 + 1) {
    pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                        (&this->m_flood_subshaders,local_fc8);
    vera::toString<unsigned_long>(&local_1008,&local_fc8);
    std::operator+(&local_fe8,"FLOOD_",&local_1008);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1028,"",&local_1029);
    (*(pvVar12->super_HaveDefines)._vptr_HaveDefines[10])(pvVar12,&local_fe8,local_1028);
    std::__cxx11::string::~string(local_1028);
    std::allocator<char>::~allocator((allocator<char> *)&local_1029);
    std::__cxx11::string::~string((string *)&local_fe8);
    std::__cxx11::string::~string((string *)&local_1008);
    pvVar12 = std::vector<vera::Shader,_std::allocator<vera::Shader>_>::operator[]
                        (&this->m_flood_subshaders,local_fc8);
    vera::getDefaultSrc_abi_cxx11_(&local_1050,(vera *)0x5,_type_10);
    vera::Shader::setSource(pvVar12,&this->m_frag_source,&local_1050);
    std::__cxx11::string::~string((string *)&local_1050);
  }
  if (((((this->m_postprocessing & 1U) != 0) || (this->m_plot == PLOT_RGB)) ||
      (this->m_plot == PLOT_RED)) ||
     (((this->m_plot == PLOT_GREEN || (this->m_plot == PLOT_BLUE)) || (this->m_plot == PLOT_LUMA))))
  {
    if (this->quilt_resolution < 0) {
      iVar7 = vera::getWindowWidth();
      iVar8 = vera::getWindowHeight();
      SceneRender::updateBuffers(&this->m_sceneRender,&this->uniforms,iVar7,iVar8);
    }
    else {
      iVar7 = vera::getQuiltWidth();
      iVar8 = vera::getQuiltHeight();
      SceneRender::updateBuffers(&this->m_sceneRender,&this->uniforms,iVar7,iVar8);
    }
  }
  return;
}

Assistant:

void Sandbox::_updateBuffers() {
    // Update Buffers
    if ( m_buffers_total != int(uniforms.buffers.size())) {
        if (verbose)
            std::cout << "Creating/removing " << uniforms.buffers.size() << " buffers to match " << m_buffers_total << std::endl;

        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            if (m_buffers_shaders[i].isLoaded())
                m_buffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.buffers.size(); i++)
            delete uniforms.buffers[i];

        uniforms.buffers.clear();
        m_buffers_shaders.clear();

        for (int i = 0; i < m_buffers_total; i++) {
            // New FBO
            uniforms.buffers.push_back( new vera::Fbo() );
            glm::vec3 size = getBufferSize(m_frag_source, "u_buffer" + vera::toString(i));
            uniforms.buffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.buffers[i]->scale = size.z;
            
            // New Shader
            m_buffers_shaders.push_back( vera::Shader() );
            m_buffers_shaders[i].addDefine("BUFFER_" + vera::toString(i));
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else
        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
            
    // Update Double Buffers
    if ( m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) ) {

        if (verbose)
            std::cout << "Creating/removing " << uniforms.doubleBuffers.size() << " double buffers to match " << m_doubleBuffers_total << std::endl;

        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            if (m_doubleBuffers_shaders[i].isLoaded())
                m_doubleBuffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++)
            delete uniforms.doubleBuffers[i];

        uniforms.doubleBuffers.clear();
        m_doubleBuffers_shaders.clear();

        for (int i = 0; i < m_doubleBuffers_total; i++) {
            // New FBO
            uniforms.doubleBuffers.push_back( new vera::PingPong() );

            glm::vec3 size = getBufferSize(m_frag_source, "u_doubleBuffer" + vera::toString(i));
            uniforms.doubleBuffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.doubleBuffers[i]->buffer(0).scale = size.z;
            uniforms.doubleBuffers[i]->buffer(1).scale = size.z;
            
            // New Shader
            m_doubleBuffers_shaders.push_back( vera::Shader() );
            m_doubleBuffers_shaders[i].addDefine("DOUBLE_BUFFER_" + vera::toString(i));
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else 
        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));

    // Update PYRAMID buffers
    if ( m_pyramid_total != int(uniforms.pyramids.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.pyramids.size() << " pyramids to create  " << m_pyramid_total << std::endl;

        for (size_t i = 0; i < m_pyramid_subshaders.size(); i++)
            if (m_pyramid_subshaders[i].isLoaded())
                m_pyramid_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.pyramids.clear();
        m_pyramid_fbos.clear();
        m_pyramid_subshaders.clear();

        for (int i = 0; i < m_pyramid_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_pyramid" + vera::toString(i));

            // Create Subshader
            m_pyramid_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.pyramids.push_back( vera::Pyramid() );
            uniforms.pyramids[i].allocate(size.x, size.y);
            uniforms.pyramids[i].scale = size.z;

            // Create pass function for this pyramid
            uniforms.pyramids[i].pass = [this](vera::Fbo *_target, const vera::Fbo *_tex0, const vera::Fbo *_tex1, int _depth) {
                _target->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_pyramid_shader.use();

                uniforms.feedTo( &m_pyramid_shader );

                m_pyramid_shader.setUniform("u_pyramidDepth", _depth);
                m_pyramid_shader.setUniform("u_pyramidTotalDepth", (int)uniforms.pyramids[0].getDepth());
                m_pyramid_shader.setUniform("u_pyramidUpscaling", _tex1 != NULL);

                m_pyramid_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_pyramid_shader.setUniformTexture("u_pyramidTex0", _tex0);
                if (_tex1 != NULL)
                    m_pyramid_shader.setUniformTexture("u_pyramidTex1", _tex1);
                m_pyramid_shader.setUniform("u_resolution", ((float)_target->getWidth()), ((float)_target->getHeight()));
                m_pyramid_shader.setUniform("u_pixel", 1.0f/((float)_target->getWidth()), 1.0f/((float)_target->getHeight()));

                vera::getBillboard()->render( &m_pyramid_shader );
                _target->unbind();
            };

            // Create input FBO
            m_pyramid_fbos.push_back( vera::Fbo() );
            m_pyramid_fbos[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            m_pyramid_fbos[i].scale = size.z;
        }
    }

    // Update PYRAMID algo
    if (m_pyramid_total > 0 ) {
        if ( checkPyramidAlgorithm( getSource(FRAGMENT) ) ) {
            m_pyramid_shader.addDefine("PYRAMID_ALGORITHM");
            m_pyramid_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_pyramid_shader.setSource(vera::getDefaultSrc(vera::FRAG_POISSONFILL), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    // Update PYRAMID subshaders
    for (size_t i = 0; i < m_pyramid_subshaders.size(); i++) {
        m_pyramid_subshaders[i].addDefine("PYRAMID_" + vera::toString(i));
        m_pyramid_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update FLOOD Buffers
    if ( m_flood_total != int(uniforms.floods.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.floods.size() << " flood to create " << m_flood_total << std::endl;

        for (size_t i = 0; i < m_flood_subshaders.size(); i++)
            if (m_flood_subshaders[i].isLoaded())
                m_flood_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.floods.clear();
        m_flood_subshaders.clear();

        for (int i = 0; i < m_flood_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_flood" + vera::toString(i));

            // Create Subshader
            m_flood_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.floods.push_back( vera::Flood() );
            uniforms.floods[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.floods[i].scale = size.z;

            // Create pass function for this flood
            uniforms.floods[i].pass = [this](vera::Fbo *_dst, const vera::Fbo *_src, int _index) {
                _dst->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_flood_shader.use();

                // uniforms.feedTo( &m_flood_shader, false, false );

                m_flood_shader.setUniform("u_resolution", ((float)_dst->getWidth()), ((float)_dst->getHeight()));
                m_flood_shader.setUniform("u_floodIndex",_index);
                m_flood_shader.setUniform("u_floodTotal", (int)uniforms.floods[0].getTotalIterations());

                m_flood_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_flood_shader.setUniformTexture("u_floodSrc", _src);

                vera::getBillboard()->render( &m_flood_shader );
                _dst->unbind();
            };
        }
    }

    if (m_flood_total > 0 ) {
        if ( checkFloodAlgorithm( getSource(FRAGMENT) ) ) {
            m_flood_shader.addDefine("FLOOD_ALGORITHM");
            m_flood_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_flood_shader.setSource(vera::getDefaultSrc(vera::FRAG_JUMPFLOOD), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    for (size_t i = 0; i < m_flood_subshaders.size(); i++) {
        m_flood_subshaders[i].addDefine("FLOOD_" + vera::toString(i));
        m_flood_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update Postprocessing
    if (m_postprocessing || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE || m_plot == PLOT_LUMA) {
        if (quilt_resolution >= 0)
            m_sceneRender.updateBuffers(uniforms, vera::getQuiltWidth(), vera::getQuiltHeight());
        else 
            m_sceneRender.updateBuffers(uniforms, vera::getWindowWidth(), vera::getWindowHeight());
    }

}